

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

void __thiscall
module_weight_html_actions::module_start(module_weight_html_actions *this,string *module)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    <h3 id=\'",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(module->_M_dataplus)._M_p,module->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'><a href=\"",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(module->_M_dataplus)._M_p,module->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".html\">",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(module->_M_dataplus)._M_p,module->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</a></h3>",9);
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << "    <h3 id='" << module << "'><a href=\"" << module << ".html\">" << module << "</a></h3>";
    }